

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O2

RK_S32 mpi_enc_opt_tsrc(void *ctx,char *next)

{
  int iVar1;
  int iVar2;
  RK_S32 RVar3;
  
  if (next == (char *)0x0) {
    RVar3 = 0;
    _mpp_log_l(2,"mpi_enc_utils","invalid input coding type %d\n",0,0);
  }
  else {
    iVar1 = atoi(next);
    iVar2 = mpp_check_support_format(0,iVar1);
    RVar3 = 1;
    if (iVar2 == 0) {
      *(int *)((long)ctx + 0x24) = iVar1;
    }
  }
  return RVar3;
}

Assistant:

RK_S32 mpi_enc_opt_tsrc(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;
    MppCodingType type = MPP_VIDEO_CodingUnused;

    if (next) {
        type = (MppCodingType)atoi(next);
        if (!mpp_check_support_format(MPP_CTX_DEC, type))
            cmd->type_src = type;
        return 1;
    }

    mpp_err("invalid input coding type %d\n", type);
    return 0;
}